

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto,FlatAllocator *alloc)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RepeatedField<int> *this_01;
  RepeatedField<int> *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 uVar2;
  PointerT<google::protobuf::SourceCodeInfo> pSVar3;
  pointer __n_00;
  pointer __s;
  PointerT<char> pcVar4;
  DescriptorPool *pDVar5;
  MethodDescriptor *pMVar6;
  pointer pOVar7;
  pointer piVar8;
  iterator iVar9;
  long lVar10;
  ctrl_t *pcVar11;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  bool bVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  DescriptorBuilder *pDVar17;
  undefined8 *puVar18;
  DescriptorBuilder *pDVar19;
  FeatureSetDefaults *compiled_defaults;
  FeatureResolver *__args;
  PointerT<google::protobuf::FileDescriptorTables> pFVar20;
  Tables *pTVar21;
  DeferredValidation *pDVar22;
  void *pvVar23;
  size_type sVar24;
  long *plVar25;
  const_reference piVar26;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar27;
  InternalMetadata IVar28;
  int *piVar29;
  FileDescriptor *pFVar30;
  Descriptor *pDVar31;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar32
  ;
  EnumDescriptor *pEVar33;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *pVVar34;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar35;
  pointer pOVar36;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar37;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>_>
  *pVVar38;
  anon_union_8_1_a8a14541_for_iterator_2 aVar39;
  anon_union_8_1_a8a14541_for_iterator_2 aVar40;
  Nonnull<const_char_*> pcVar41;
  difference_type __n_1;
  ulong uVar42;
  int iVar43;
  pointer pcVar44;
  void *extraout_RDX;
  FileDescriptorProto *proto_00;
  FileDescriptor *result_00;
  SourceCodeInfo *this_03;
  byte bVar45;
  undefined1 *puVar46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  size_type sVar47;
  RepeatedPtrFieldBase *pRVar48;
  long lVar49;
  char *pcVar50;
  ErrorLocation location;
  ServiceDescriptor *pSVar51;
  size_type __n;
  long lVar52;
  once_flag *__dest;
  OptionsToInterpret *options_to_interpret;
  int i_1;
  long lVar53;
  long lVar54;
  long in_FS_OFFSET;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view name;
  string_view key_00;
  string_view name_00;
  string_view name_01;
  string_view element_name_03;
  string_view element_name_04;
  iterator iVar55;
  FileDescriptor *result;
  FileDescriptor *dependency;
  FlatAllocator lazy_dep_alloc;
  StatusOr<google::protobuf::FeatureResolver> feature_resolver;
  DescriptorBuilder *local_248;
  DescriptorBuilder *local_230;
  DescriptorBuilder *local_228;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>::iterator,_bool>
  local_220;
  DescriptorBuilder *local_208;
  FileDescriptorProto *local_200;
  DescriptorBuilder *local_1f8;
  RepeatedPtrFieldBase *local_1f0;
  undefined1 local_1e8 [16];
  Base<google::protobuf::SourceCodeInfo> local_1d8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  rStack_1d0;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  local_1b0;
  DynamicMessageFactory local_190 [2];
  SourceCodeInfo *local_108;
  RepeatedPtrFieldBase *local_100;
  undefined1 *local_f8;
  code *pcStack_f0;
  undefined1 *local_e8;
  code *pcStack_e0;
  undefined1 *local_d8;
  code *pcStack_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  StatusOrData<google::protobuf::FeatureResolver> local_88;
  
  pDVar17 = (DescriptorBuilder *)
            anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FileDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,(int)proto);
  this->file_ = (FileDescriptor *)pDVar17;
  local_228 = pDVar17;
  if ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x20) ==
      (undefined1  [232])0x0) {
    pcVar50 = (char *)((ulong)(proto->field_0)._impl_.syntax_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    pDVar19 = pDVar17;
    if (*(long *)(pcVar50 + 8) != 0) {
      iVar15 = std::__cxx11::string::compare(pcVar50);
      if (iVar15 != 0) {
        iVar15 = std::__cxx11::string::compare
                           ((char *)((ulong)(proto->field_0)._impl_.syntax_.tagged_ptr_.ptr_ &
                                    0xfffffffffffffffc));
        if (iVar15 == 0) {
          this->file_->edition_ = EDITION_PROTO3;
        }
        else {
          this->file_->edition_ = EDITION_UNKNOWN;
          puVar18 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          local_d8 = local_1e8;
          local_1e8._0_8_ = proto;
          pcStack_d0 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
          ;
          make_error.invoker_._0_4_ = 0x1798e7;
          make_error.ptr_.obj = local_d8;
          make_error.invoker_._4_4_ = 0;
          element_name._M_str = (char *)*puVar18;
          element_name._M_len = puVar18[1];
          AddError(this,element_name,&proto->super_Message,OTHER,make_error);
        }
        goto LAB_001640dc;
      }
      pDVar19 = (DescriptorBuilder *)this->file_;
    }
    *(Edition *)
     &(pDVar19->feature_resolver_).
      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload = EDITION_PROTO2;
  }
  else {
    *(int *)&(pDVar17->feature_resolver_).
             super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
             super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
             super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload =
         (proto->field_0)._impl_.edition_;
  }
LAB_001640dc:
  compiled_defaults = DescriptorPool::GetFeatureSetDefaults(this->pool_);
  FeatureResolver::Create
            ((StatusOr<google::protobuf::FeatureResolver> *)&local_88,this->file_->edition_,
             compiled_defaults);
  if (local_88.field_0 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1)0x1) {
    __args = absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::value
                       ((StatusOr<google::protobuf::FeatureResolver> *)&local_88);
    std::optional<google::protobuf::FeatureResolver>::emplace<google::protobuf::FeatureResolver>
              (&this->feature_resolver_,__args);
  }
  else {
    puVar18 = (undefined8 *)
              ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    local_e8 = local_1e8;
    local_1e8._0_8_ = &local_88;
    pcStack_e0 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
    ;
    make_error_00.invoker_._0_4_ = 0x179933;
    make_error_00.ptr_.obj = local_e8;
    make_error_00.invoker_._4_4_ = 0;
    element_name_00._M_str = (char *)*puVar18;
    element_name_00._M_len = puVar18[1];
    AddError(this,element_name_00,&proto->super_Message,EDITIONS,make_error_00);
  }
  *(undefined2 *)((SymbolBase *)&pDVar17->pool_ + 1) = 0;
  if ((((undefined1  [232])proto->field_0 & (undefined1  [232])0x10) != (undefined1  [232])0x0) &&
     ((proto->field_0)._impl_.source_code_info_ == (SourceCodeInfo *)0x0)) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.source_code_info_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x33e3);
  }
  if (((undefined1  [232])proto->field_0 & (undefined1  [232])0x10) == (undefined1  [232])0x0) {
    puVar46 = _SourceCodeInfo_default_instance_;
    this_03 = (SourceCodeInfo *)0x0;
  }
  else {
    if ((alloc->
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1b0,"has_allocated()");
      goto LAB_00165c7d;
    }
    pSVar3 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
    iVar15 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).used_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
    iVar43 = iVar15 + 1;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value = iVar43;
    iVar16 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).total_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
    if (iVar16 < iVar43) {
      pcVar41 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)iVar43,(long)iVar16,"used <= total_.template Get<TypeToUse>()");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1b6,pcVar41);
      goto LAB_00165c7d;
    }
    this_03 = pSVar3 + iVar15;
    puVar46 = (undefined1 *)(proto->field_0)._impl_.source_code_info_;
    if ((SourceCodeInfo *)puVar46 == (SourceCodeInfo *)0x0) {
      puVar46 = _SourceCodeInfo_default_instance_;
    }
    SourceCodeInfo::CopyFrom(this_03,(SourceCodeInfo *)puVar46);
    puVar46 = (undefined1 *)this_03;
  }
  (pDVar17->filename_)._M_string_length = (size_type)puVar46;
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x1b0,"has_allocated()");
    goto LAB_00165c7d;
  }
  pFVar20 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  iVar15 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).used_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  iVar43 = iVar15 + 1;
  (alloc->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).used_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value = iVar43;
  iVar16 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).total_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  if (iVar16 < iVar43) {
    pcVar41 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        ((long)iVar43,(long)iVar16,"used <= total_.template Get<TypeToUse>()");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x1b6,pcVar41);
    goto LAB_00165c7d;
  }
  pFVar20 = pFVar20 + iVar15;
  this->file_tables_ = pFVar20;
  this->file_->tables_ = pFVar20;
  if ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x1) ==
      (undefined1  [232])0x0) {
    AddError(this,(string_view)(ZEXT816(0x3995cd) << 0x40),&proto->super_Message,OTHER,
             "Missing field: FileDescriptorProto.name.");
  }
  in = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  pTVar21 = (Tables *)
            (anonymous_namespace)::
            FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
            ::AllocateStrings<std::__cxx11::string_const&>
                      ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        *)alloc,in);
  pDVar17->tables_ = pTVar21;
  if ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x2) ==
      (undefined1  [232])0x0) {
    pDVar22 = (DeferredValidation *)
              (anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::AllocateStrings<char_const(&)[1]>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)alloc,(char (*) [1])in);
  }
  else {
    pDVar22 = (DeferredValidation *)
              (anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::AllocateStrings<std::__cxx11::string_const&>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)alloc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((ulong)(proto->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
  }
  pDVar17->deferred_validation_ = pDVar22;
  pDVar17->error_collector_ = (ErrorCollector *)this->pool_;
  __n_00 = (pDVar17->tables_->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__n_00 == (pointer)0x0) {
LAB_00164371:
    bVar12 = DescriptorPool::Tables::AddFile(this->tables_,(FileDescriptor *)pDVar17);
    if (bVar12) {
      sVar47 = *(size_type *)((_Alloc_hider *)pDVar17->deferred_validation_->initial_buffer_ + 1);
      if (sVar47 != 0) {
        pcVar44 = ((_Alloc_hider *)pDVar17->deferred_validation_->initial_buffer_)->_M_p;
        sVar24 = 0;
        uVar42 = 0;
        do {
          uVar42 = uVar42 + (pcVar44[sVar24] == '.');
          sVar24 = sVar24 + 1;
        } while (sVar47 != sVar24);
        if (100 < uVar42) {
          pcVar50 = "Exceeds Maximum Package Depth";
          location = NAME;
          goto LAB_001643ee;
        }
        name._M_str = pcVar44;
        name._M_len = sVar47;
        AddPackage(this,name,&proto->super_Message,(FileDescriptor *)pDVar17,true);
      }
      local_a8._0_8_ = (_func_int **)0x1;
      local_a8._8_8_ = 0;
      iVar15 = *(int *)((long)&proto->field_0 + 0x10);
      *(int *)((long)&(pDVar17->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x10) = iVar15;
      pcVar4 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).pointers_.payload_.super_Base<char>.value;
      if (pcVar4 == (PointerT<char>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b0,"has_allocated()");
LAB_00165c7d:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_1e8);
      }
      iVar16 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).used_.payload_.super_Base<char>.value;
      iVar43 = iVar16 + iVar15 * 8;
      (alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).used_.payload_.super_Base<char>.value = iVar43;
      iVar15 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).total_.payload_.super_Base<char>.value;
      if (iVar15 < iVar43) {
        pcVar41 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar43,(long)iVar15,"used <= total_.template Get<TypeToUse>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b6,pcVar41);
        goto LAB_00165c7d;
      }
      *(PointerT<char> *)
       ((long)&(pDVar17->feature_resolver_).
               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
               super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
               defaults_ + 0x28) = pcVar4 + iVar16;
      ((InternalMetadata *)
      ((long)&(pDVar17->feature_resolver_).
              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
              super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
              defaults_ + 8))->ptr_ = 0;
      local_1f8 = (DescriptorBuilder *)&this->unused_dependency_;
      local_108 = this_03;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *)local_1f8);
      local_c8._0_8_ = (DescriptorPool *)0x1;
      local_c8._8_8_ = (Tables *)0x0;
      this_01 = &(proto->field_0)._impl_.weak_dependency_;
      for (iVar15 = 0;
          iVar16 = internal::SooRep::size
                             (&this_01->soo_rep_,
                              (undefined1  [16])
                              ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4
                              ) == (undefined1  [16])0x0), iVar15 < iVar16; iVar15 = iVar15 + 1) {
        piVar26 = RepeatedField<int>::Get(this_01,iVar15);
        local_208 = (DescriptorBuilder *)CONCAT44(local_208._4_4_,*piVar26);
        local_220.first.ctrl_ = (ctrl_t *)local_c8;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
                    *)local_1e8,&local_220,(int *)&local_208,(int *)&local_208);
      }
      local_230 = (DescriptorBuilder *)((ulong)local_230 & 0xffffffff00000000);
      if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
        this_00 = &(proto->field_0)._impl_.dependency_;
        iVar15 = 0;
        bVar14 = 0;
        do {
          bVar45 = bVar14;
          pVVar27 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                              (&this_00->super_RepeatedPtrFieldBase,iVar15);
          local_220.first.ctrl_ = (ctrl_t *)local_a8;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                      *)local_1e8,&local_220,pVVar27,pVVar27);
          if (local_1d8.value._0_1_ == false) {
            AddTwiceListedError(this,proto,(int)local_230);
          }
          pTVar21 = this->tables_;
          pVVar27 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                              (&this_00->super_RepeatedPtrFieldBase,(int)local_230);
          key_00._M_str = (pVVar27->_M_dataplus)._M_p;
          key_00._M_len = pVVar27->_M_string_length;
          local_208 = (DescriptorBuilder *)DescriptorPool::Tables::FindFile(pTVar21,key_00);
          if (local_208 == (DescriptorBuilder *)0x0) {
            pDVar5 = this->pool_->underlay_;
            if (pDVar5 != (DescriptorPool *)0x0) {
              pVVar27 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                  (&this_00->super_RepeatedPtrFieldBase,(int)local_230);
              name_00._M_str = (pVVar27->_M_dataplus)._M_p;
              name_00._M_len = pVVar27->_M_string_length;
              local_208 = (DescriptorBuilder *)DescriptorPool::FindFileByName(pDVar5,name_00);
              goto LAB_001645ea;
            }
            if (pDVar17 == (DescriptorBuilder *)0x0) goto LAB_00165a8b;
LAB_001646a7:
            pDVar5 = this->pool_;
            if (pDVar5->lazily_build_dependencies_ == false) {
              if (pDVar5->allow_unknown_ == false) {
                if (pDVar5->enforce_weak_ == false) {
                  iVar55 = absl::lts_20250127::container_internal::
                           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                           ::find<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                        *)local_c8,(key_arg<int> *)&local_230);
                  absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                  ::AssertNotDebugCapacity
                            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                              *)local_c8);
                  if (iVar55.ctrl_ != (ctrl_t *)0x0) goto LAB_001646f0;
                }
                AddImportError(this,proto,(int)local_230);
              }
              else {
LAB_001646f0:
                iVar15 = 0;
                memset((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        *)local_1e8,0,0xe0);
                anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::PlanArray<google::protobuf::FileDescriptor>
                          ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                            *)local_1e8,iVar15);
                (anonymous_namespace)::
                FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                ::PlanArray<std::__cxx11::string>
                          ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                            *)local_1e8,1);
                (anonymous_namespace)::
                FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
                          ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                            *)local_1e8,(Tables **)this->tables_);
                pDVar5 = this->pool_;
                pVVar27 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&this_00->super_RepeatedPtrFieldBase,(int)local_230);
                name_01._M_str = (pVVar27->_M_dataplus)._M_p;
                name_01._M_len = pVVar27->_M_string_length;
                local_208 = (DescriptorBuilder *)
                            DescriptorPool::NewPlaceholderFileWithMutexHeld
                                      (pDVar5,name_01,(FlatAllocator *)local_1e8);
              }
            }
          }
          else {
LAB_001645ea:
            if (local_208 == pDVar17) goto LAB_00165a8b;
            if (local_208 == (DescriptorBuilder *)0x0) goto LAB_001646a7;
            if (this->pool_->enforce_dependencies_ == true) {
              local_1e8 = (undefined1  [16])
                          absl::lts_20250127::container_internal::
                          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                          ::find<std::__cxx11::string>
                                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                                      *)&this->pool_->direct_input_files_,
                                     (key_arg<std::__cxx11::basic_string<char>_> *)
                                     ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::AssertNotDebugCapacity
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                          *)&this->pool_->direct_input_files_);
              local_220.first.ctrl_ = (ctrl_t *)0x0;
              bVar12 = absl::lts_20250127::container_internal::operator==
                                 ((iterator *)local_1e8,(iterator *)&local_220);
              if ((!bVar12) &&
                 (*(int *)((long)&(local_208->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x14) == 0)) {
                local_220.first.ctrl_ = (ctrl_t *)local_1f8;
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                ::EmplaceDecomposable::operator()
                          ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
                            *)local_1e8,&local_220,(FileDescriptor **)&local_208,
                           (FileDescriptor **)&local_208);
              }
            }
          }
          (*(FileDescriptor ***)
            ((long)&(pDVar17->feature_resolver_).
                    super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload
                    .super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                    super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                    _M_value.defaults_ + 0x28))[(int)local_230] = (FileDescriptor *)local_208;
          bVar13 = local_208 == (DescriptorBuilder *)0x0 & this->pool_->lazily_build_dependencies_;
          iVar15 = (int)local_230 + 1;
          local_230 = (DescriptorBuilder *)CONCAT44(local_230._4_4_,iVar15);
          iVar16 = *(int *)((long)&proto->field_0 + 0x10);
          bVar14 = bVar45 | bVar13;
        } while (iVar15 < iVar16);
        if (bVar45 != 0 || bVar13 != 0) {
          if (iVar16 < 1) {
            iVar15 = 4;
          }
          else {
            lVar52 = 0;
            iVar43 = 0;
            do {
              iVar15 = iVar43;
              if ((*(FileDescriptor ***)
                    ((long)&(pDVar17->feature_resolver_).
                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                            _M_payload.
                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                            .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                            _M_payload._M_value.defaults_ + 0x28))[lVar52] == (FileDescriptor *)0x0)
              {
                pVVar27 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&this_00->super_RepeatedPtrFieldBase,(int)lVar52);
                iVar15 = iVar43 + (int)pVVar27->_M_string_length;
                iVar16 = *(int *)((long)&proto->field_0 + 0x10);
              }
              iVar43 = iVar15 + 1;
              lVar52 = lVar52 + 1;
            } while (lVar52 < iVar16);
            iVar15 = iVar15 + 5;
          }
          IVar28.ptr_ = (intptr_t)DescriptorPool::Tables::AllocateBytes(this->tables_,iVar15);
          *(__int_type_conflict1 *)IVar28.ptr_ = 0;
          ((InternalMetadata *)
          ((long)&(pDVar17->feature_resolver_).
                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                  super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                  _M_value.defaults_ + 8))->ptr_ = IVar28.ptr_;
          if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
            __dest = (once_flag *)(IVar28.ptr_ + 4);
            lVar52 = 0;
            do {
              if ((*(FileDescriptor ***)
                    ((long)&(local_228->feature_resolver_).
                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                            _M_payload.
                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                            .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                            _M_payload._M_value.defaults_ + 0x28))[lVar52] == (FileDescriptor *)0x0)
              {
                iVar15 = (int)lVar52;
                pVVar27 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&this_00->super_RepeatedPtrFieldBase,iVar15);
                pcVar44 = (pVVar27->_M_dataplus)._M_p;
                pVVar27 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&this_00->super_RepeatedPtrFieldBase,iVar15);
                memcpy(__dest,pcVar44,pVVar27->_M_string_length);
                pVVar27 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&this_00->super_RepeatedPtrFieldBase,iVar15);
                __dest = (once_flag *)
                         ((long)&(__dest->control_).super___atomic_base<unsigned_int>._M_i +
                         pVVar27->_M_string_length);
              }
              *(undefined1 *)&(__dest->control_).super___atomic_base<unsigned_int>._M_i = 0;
              __dest = (once_flag *)
                       ((long)&(__dest->control_).super___atomic_base<unsigned_int>._M_i + 1);
              lVar52 = lVar52 + 1;
            } while (lVar52 < *(int *)((long)&proto->field_0 + 0x10));
          }
        }
      }
      this_02 = &(proto->field_0)._impl_.public_dependency_;
      iVar15 = internal::SooRep::size
                         (&this_02->soo_rep_,(*(byte *)((long)&proto->field_0 + 0x80) & 4) == 0);
      piVar29 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<int>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar15);
      pDVar17 = local_228;
      *(int **)((long)&(local_228->feature_resolver_).
                       super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                       _M_payload.
                       super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                       .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                       _M_value.defaults_ + 0x30) = piVar29;
      iVar15 = 0;
      for (iVar16 = 0;
          iVar43 = internal::SooRep::size
                             (&this_02->soo_rep_,
                              (undefined1  [16])
                              ((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4
                              ) == (undefined1  [16])0x0), iVar16 < iVar43; iVar16 = iVar16 + 1) {
        piVar26 = RepeatedField<int>::Get(this_02,iVar16);
        iVar43 = *piVar26;
        if ((iVar43 < 0) || (*(int *)((long)&proto->field_0 + 0x10) <= iVar43)) {
          puVar18 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          element_name_03._M_str = (char *)*puVar18;
          element_name_03._M_len = puVar18[1];
          AddError(this,element_name_03,&proto->super_Message,OTHER,
                   "Invalid public dependency index.");
        }
        else {
          lVar52 = (long)iVar15;
          iVar15 = iVar15 + 1;
          *(int *)(*(long *)((long)&(pDVar17->feature_resolver_).
                                    super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                    .super__Optional_payload_base<google::protobuf::FeatureResolver>
                                    ._M_payload._M_value.defaults_ + 0x30) + lVar52 * 4) = iVar43;
          if (this->pool_->lazily_build_dependencies_ == false) {
            pFVar30 = FileDescriptor::dependency((FileDescriptor *)pDVar17,iVar43);
            local_1e8._0_8_ = pFVar30;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::erase<google::protobuf::FileDescriptor_const*>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)local_1f8,(key_arg<const_google::protobuf::FileDescriptor_*> *)local_1e8);
          }
        }
      }
      *(int *)((long)&(pDVar17->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x14) = iVar15;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::clear(&(this->dependencies_).
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             );
      if ((this->pool_->lazily_build_dependencies_ == false) &&
         (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                              _M_payload.
                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                              .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                              _M_payload + 0x10))) {
        iVar15 = 0;
        do {
          pFVar30 = FileDescriptor::dependency((FileDescriptor *)pDVar17,iVar15);
          RecordPublicDependencies(this,pFVar30);
          iVar15 = iVar15 + 1;
          pDVar17 = local_228;
        } while (iVar15 < *(int *)((long)&(local_228->feature_resolver_).
                                          super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<google::protobuf::FeatureResolver>
                                          ._M_payload + 0x10));
      }
      iVar15 = internal::SooRep::size
                         (&this_01->soo_rep_,
                          (undefined1  [16])
                          ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                          (undefined1  [16])0x0);
      piVar29 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<int>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar15);
      *(int **)((long)&(pDVar17->feature_resolver_).
                       super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                       _M_payload.
                       super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                       .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                       _M_value.defaults_ + 0x38) = piVar29;
      iVar15 = 0;
      for (iVar16 = 0;
          iVar43 = internal::SooRep::size
                             (&this_01->soo_rep_,
                              (undefined1  [16])
                              ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4
                              ) == (undefined1  [16])0x0), iVar16 < iVar43; iVar16 = iVar16 + 1) {
        piVar26 = RepeatedField<int>::Get(this_01,iVar16);
        iVar43 = *piVar26;
        if ((iVar43 < 0) || (*(int *)((long)&proto->field_0 + 0x10) <= iVar43)) {
          puVar18 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          element_name_04._M_str = (char *)*puVar18;
          element_name_04._M_len = puVar18[1];
          AddError(this,element_name_04,&proto->super_Message,OTHER,"Invalid weak dependency index."
                  );
        }
        else {
          lVar52 = (long)iVar15;
          iVar15 = iVar15 + 1;
          (*(int **)((long)&(pDVar17->feature_resolver_).
                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                            _M_payload.
                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                            .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                            _M_payload._M_value.defaults_ + 0x38))[lVar52] = iVar43;
        }
      }
      *(int *)((long)&(pDVar17->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x18) = iVar15;
      iVar15 = *(int *)((long)&proto->field_0 + 0x28);
      *(int *)((long)&(pDVar17->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x1c) = iVar15;
      pDVar31 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::Descriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar15);
      *(Descriptor **)
       ((long)&(pDVar17->feature_resolver_).
               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
               super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
               defaults_ + 0x40) = pDVar31;
      if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
        lVar52 = 0;
        lVar53 = 0;
        do {
          pVVar32 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                              (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                               (int)lVar53);
          BuildMessage(this,pVVar32,(Descriptor *)0x0,
                       (Descriptor *)
                       (&(*(Descriptor **)
                           ((long)&(pDVar17->feature_resolver_).
                                   super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                   .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                   _M_payload._M_value.defaults_ + 0x40))->super_SymbolBase + lVar52
                       ),alloc);
          lVar53 = lVar53 + 1;
          lVar52 = lVar52 + 0xa0;
        } while (lVar53 < *(int *)((long)&proto->field_0 + 0x28));
      }
      iVar15 = *(int *)((long)&proto->field_0 + 0x40);
      *(int *)((long)&(pDVar17->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x20) = iVar15;
      pEVar33 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::EnumDescriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar15);
      *(EnumDescriptor **)
       ((long)&(pDVar17->feature_resolver_).
               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
               super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
               defaults_ + 0x48) = pEVar33;
      if (0 < *(int *)((long)&proto->field_0 + 0x40)) {
        lVar52 = 0;
        lVar53 = 0;
        do {
          pVVar34 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                              (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                               (int)lVar53);
          BuildEnum(this,pVVar34,(Descriptor *)0x0,
                    (EnumDescriptor *)
                    (&(*(EnumDescriptor **)
                        ((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload._M_value.defaults_ + 0x48))->super_SymbolBase + lVar52),
                    alloc);
          lVar53 = lVar53 + 1;
          lVar52 = lVar52 + 0x58;
        } while (lVar53 < *(int *)((long)&proto->field_0 + 0x40));
      }
      iVar15 = *(int *)((long)&proto->field_0 + 0x58);
      *(int *)((long)&(pDVar17->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x24) = iVar15;
      pcVar4 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).pointers_.payload_.super_Base<char>.value;
      if (pcVar4 == (PointerT<char>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b0,"has_allocated()");
        goto LAB_00165c7d;
      }
      iVar16 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).used_.payload_.super_Base<char>.value;
      iVar43 = iVar15 * 0x40 + iVar16;
      (alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).used_.payload_.super_Base<char>.value = iVar43;
      iVar15 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).total_.payload_.super_Base<char>.value;
      if (iVar15 < iVar43) {
        pcVar41 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar43,(long)iVar15,"used <= total_.template Get<TypeToUse>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b6,pcVar41);
        goto LAB_00165c7d;
      }
      *(ServiceDescriptor **)
       &(pDVar17->feature_resolver_).
        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
        super__Optional_payload_base<google::protobuf::FeatureResolver>._M_engaged =
           (ServiceDescriptor *)(pcVar4 + iVar16);
      if (0 < *(int *)((long)&proto->field_0 + 0x58)) {
        lVar52 = 0;
        lVar53 = 0;
        do {
          pVVar35 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                              (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                               (int)lVar53);
          BuildService(this,pVVar35,extraout_RDX,
                       (ServiceDescriptor *)
                       (&(*(ServiceDescriptor **)
                           &(pDVar17->feature_resolver_).
                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                            _M_payload.
                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                            .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                            _M_engaged)->super_SymbolBase + lVar52),alloc);
          lVar53 = lVar53 + 1;
          lVar52 = lVar52 + 0x40;
        } while (lVar53 < *(int *)((long)&proto->field_0 + 0x58));
      }
      iVar15 = *(int *)((long)&proto->field_0 + 0x70);
      *(int *)((SymbolBase *)&pDVar17->pool_ + 4) = iVar15;
      pOVar36 = (pointer)anon_unknown_24::
                         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ::AllocateArray<google::protobuf::FieldDescriptor>
                                   (&alloc->
                                     super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                    ,iVar15);
      (pDVar17->options_to_interpret_).
      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ._M_impl.super__Vector_impl_data._M_start = pOVar36;
      if (0 < *(int *)((long)&proto->field_0 + 0x70)) {
        lVar52 = 0;
        lVar53 = 0;
        do {
          pVVar37 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                              (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                               (int)lVar53);
          BuildFieldOrExtension
                    (this,pVVar37,(Descriptor *)0x0,
                     (FieldDescriptor *)
                     ((long)&(((pDVar17->options_to_interpret_).
                               super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                               ._M_impl.super__Vector_impl_data._M_start)->name_scope)._M_dataplus.
                             _M_p + lVar52),true,alloc);
          lVar53 = lVar53 + 1;
          lVar52 = lVar52 + 0x58;
        } while (lVar53 < *(int *)((long)&proto->field_0 + 0x70));
      }
      AllocateOptions(this,proto,(FileDescriptor *)pDVar17,alloc);
      pDVar17 = local_228;
      local_248 = local_228;
      CrossLinkFile(this,(FileDescriptor *)local_228,proto);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                  *)&this->message_hints_);
      if (1 < *(size_t *)
               ((long)&(this->message_hints_).
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value + 8)) {
        SuggestFieldNumbers(this,(FileDescriptor *)pDVar17,proto_00);
      }
      bVar14 = this->had_errors_;
      if ((bool)bVar14 == false) {
        OptionInterpreter::OptionInterpreter((OptionInterpreter *)local_1e8,this);
        pOVar36 = (this->options_to_interpret_).
                  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pOVar36 !=
            (this->options_to_interpret_).
            super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            OptionInterpreter::InterpretOptionsImpl((OptionInterpreter *)local_1e8,pOVar36,true);
            pOVar36 = pOVar36 + 1;
          } while (pOVar36 !=
                   (this->options_to_interpret_).
                   super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        uVar2 = *(undefined1 *)(in_FS_OFFSET + -0x60);
        *(undefined1 *)(in_FS_OFFSET + -0x60) = 0;
        local_220.first.ctrl_ = (ctrl_t *)this;
        local_220.first.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)alloc;
        ResolveFeaturesImpl<google::protobuf::FileDescriptor>
                  (this,*(Edition *)
                         &(pDVar17->feature_resolver_).
                          super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                          _M_payload.
                          super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                          .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                          _M_payload,proto,(FileDescriptor *)pDVar17,
                   (OptionsType *)
                   (pDVar17->options_to_interpret_).
                   super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   ._M_impl.super__Vector_impl_data._M_finish,alloc,EDITIONS,true);
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x1c)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x40);
            pVVar32 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
            ::Visit<google::protobuf::DescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
                        *)&local_220,(Descriptor *)(lVar49 + lVar52),pVVar32);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0xa0;
          } while (lVar53 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x1c));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x20)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x48);
            pVVar34 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
            ::Visit<google::protobuf::EnumDescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
                        *)&local_220,(EnumDescriptor *)(lVar49 + lVar52),pVVar34);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0x58;
          } while (lVar53 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x20));
        }
        if (0 < *(int *)((long)&pDVar17->pool_ + 4)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            pOVar36 = (pDVar17->options_to_interpret_).
                      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar37 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            ResolveFeaturesImpl<google::protobuf::FieldDescriptor>
                      (this,*(Edition *)
                             (*(long *)((long)&(pOVar36->name_scope).field_2 + lVar52) + 0x20),
                       pVVar37,(FieldDescriptor *)
                               ((long)&(pOVar36->name_scope)._M_dataplus._M_p + lVar52),
                       *(OptionsType **)((long)&(pOVar36->element_name).field_2 + lVar52 + 8U),alloc
                       ,NAME,false);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0x58;
          } while (lVar53 < *(int *)((long)&pDVar17->pool_ + 4));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x24)) {
          local_100 = &(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase;
          pRVar48 = (RepeatedPtrFieldBase *)0x0;
          do {
            pSVar51 = (ServiceDescriptor *)
                      ((long)pRVar48 * 0x40 +
                      *(long *)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_engaged);
            local_1f0 = pRVar48;
            pVVar35 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                (local_100,(int)pRVar48);
            ResolveFeaturesImpl<google::protobuf::ServiceDescriptor>
                      (this,pSVar51->file_->edition_,pVVar35,pSVar51,pSVar51->options_,alloc,NAME,
                       false);
            if (0 < pSVar51->method_count_) {
              lVar52 = 0;
              lVar53 = 0;
              do {
                pMVar6 = pSVar51->methods_;
                pVVar38 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                    (&(pVVar35->field_0)._impl_.method_.super_RepeatedPtrFieldBase,
                                     (int)lVar53);
                ResolveFeaturesImpl<google::protobuf::MethodDescriptor>
                          (this,*(Edition *)
                                 (*(long *)(*(long *)((long)&pMVar6->service_ + lVar52) + 0x10) +
                                 0x20),pVVar38,
                           (MethodDescriptor *)(&pMVar6->super_SymbolBase + lVar52),
                           *(OptionsType **)((long)&pMVar6->options_ + lVar52),alloc,NAME,false);
                lVar53 = lVar53 + 1;
                lVar52 = lVar52 + 0x50;
              } while (lVar53 < pSVar51->method_count_);
            }
            pRVar48 = (RepeatedPtrFieldBase *)((long)&local_1f0->tagged_rep_or_elem_ + 1);
          } while ((long)pRVar48 <
                   (long)*(int *)((long)&(pDVar17->feature_resolver_).
                                         super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<google::protobuf::FeatureResolver>
                                         ._M_payload + 0x24));
        }
        *(undefined1 *)(in_FS_OFFSET + -0x60) = uVar2;
        local_220.first.ctrl_ = (ctrl_t *)this;
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x1c)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x40);
            pVVar32 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_4>>
            ::Visit<google::protobuf::DescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__4>>
                        *)&local_220,(Descriptor *)(lVar49 + lVar52),pVVar32);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0xa0;
          } while (lVar53 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x1c));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x20)) {
          lVar52 = 0;
          do {
            lVar53 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x48);
            pVVar34 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar52);
            if (0 < *(int *)(lVar53 + 4 + lVar52 * 0x58)) {
              iVar15 = 0;
              do {
                internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                          (&(pVVar34->field_0)._impl_.value_.super_RepeatedPtrFieldBase,iVar15);
                iVar15 = iVar15 + 1;
              } while (iVar15 < *(int *)(lVar53 + lVar52 * 0x58 + 4));
            }
            lVar52 = lVar52 + 1;
          } while (lVar52 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x20));
        }
        if (0 < *(int *)((long)&pDVar17->pool_ + 4)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            pOVar36 = (pDVar17->options_to_interpret_).
                      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar37 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            PostProcessFieldFeatures
                      (this,(FieldDescriptor *)
                            ((long)&(pOVar36->name_scope)._M_dataplus._M_p + lVar52),pVVar37);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0x58;
          } while (lVar53 < *(int *)((long)&pDVar17->pool_ + 4));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x24)) {
          lVar52 = 0;
          do {
            lVar53 = *(long *)&(pDVar17->feature_resolver_).
                               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                               ._M_payload.
                               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                               .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                               _M_engaged;
            pVVar35 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                                 (int)lVar52);
            if (0 < *(int *)(lVar53 + 0x38 + lVar52 * 0x40)) {
              iVar15 = 0;
              do {
                internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                          (&(pVVar35->field_0)._impl_.method_.super_RepeatedPtrFieldBase,iVar15);
                iVar15 = iVar15 + 1;
              } while (iVar15 < *(int *)(lVar53 + lVar52 * 0x40 + 0x38));
            }
            lVar52 = lVar52 + 1;
          } while (lVar52 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x24));
        }
        pOVar36 = (this->options_to_interpret_).
                  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pOVar36 !=
            (this->options_to_interpret_).
            super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            options_to_interpret = pOVar36;
            OptionInterpreter::InterpretOptionsImpl
                      ((OptionInterpreter *)local_1e8,options_to_interpret,false);
            pOVar36 = options_to_interpret + 1;
          } while (pOVar36 !=
                   (this->options_to_interpret_).
                   super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          pOVar7 = (this->options_to_interpret_).
                   super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pOVar36 != pOVar7) {
            pOVar36 = pOVar7 + -1;
            do {
              piVar8 = pOVar36[1].element_path.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start;
              if (piVar8 != (pointer)0x0) {
                operator_delete(piVar8,(long)pOVar36[1].element_path.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_end_of_storage -
                                       (long)piVar8);
              }
              pcVar44 = pOVar36[1].element_name._M_dataplus._M_p;
              paVar1 = &pOVar36[1].element_name.field_2;
              if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)pcVar44) {
                operator_delete(pcVar44,paVar1->_M_allocated_capacity + 1);
              }
              pcVar44 = pOVar36[1].name_scope._M_dataplus._M_p;
              paVar1 = &pOVar36[1].name_scope.field_2;
              if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)pcVar44) {
                operator_delete(pcVar44,paVar1->_M_allocated_capacity + 1);
              }
              pOVar36 = pOVar36 + 1;
            } while (options_to_interpret != pOVar36);
            (this->options_to_interpret_).
            super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
            ._M_impl.super__Vector_impl_data._M_finish = pOVar7;
          }
        }
        if (local_108 != (SourceCodeInfo *)0x0) {
          OptionInterpreter::UpdateSourceCodeInfo((OptionInterpreter *)local_1e8,local_108);
        }
        DynamicMessageFactory::~DynamicMessageFactory(local_190);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ::~raw_hash_set(&local_1b0);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::~raw_hash_set(&rStack_1d0);
        bVar14 = this->had_errors_;
      }
      if (((bVar14 & 1) == 0) && (this->pool_->lazily_build_dependencies_ == false)) {
        local_1e8._0_8_ = this;
        ValidateOptions(this,(FileDescriptor *)pDVar17,proto);
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x1c)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x40);
            pVVar32 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_5>>
            ::Visit<google::protobuf::DescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__5>>
                        *)local_1e8,(Descriptor *)(lVar49 + lVar52),pVVar32);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0xa0;
          } while (lVar53 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x1c));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x20)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x48);
            pVVar34 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_5>>
            ::Visit<google::protobuf::EnumDescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__5>>
                        *)this,(EnumDescriptor *)(lVar49 + lVar52),pVVar34);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0x58;
          } while (lVar53 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x20));
        }
        if (0 < *(int *)((long)&pDVar17->pool_ + 4)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            pOVar36 = (pDVar17->options_to_interpret_).
                      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar37 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            ValidateOptions(this,(FieldDescriptor *)
                                 ((long)&(pOVar36->name_scope)._M_dataplus._M_p + lVar52),pVVar37);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0x58;
          } while (lVar53 < *(int *)((long)&pDVar17->pool_ + 4));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x24)) {
          lVar52 = 0;
          do {
            pSVar51 = (ServiceDescriptor *)
                      (lVar52 * 0x40 +
                      *(long *)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_engaged);
            pVVar35 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                                 (int)lVar52);
            ValidateOptions(this,pSVar51,pVVar35);
            if (0 < pSVar51->method_count_) {
              iVar15 = 0;
              do {
                internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                          (&(pVVar35->field_0)._impl_.method_.super_RepeatedPtrFieldBase,iVar15);
                iVar15 = iVar15 + 1;
              } while (iVar15 < pSVar51->method_count_);
            }
            lVar52 = lVar52 + 1;
          } while (lVar52 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x24));
        }
        bVar14 = this->had_errors_;
      }
      if (((bVar14 & 1) != 0) && (0 < *(int *)((long)&proto->field_0 + 0x28))) {
        lVar52 = 0;
        lVar53 = 0;
        do {
          lVar49 = (long)*(int *)((long)&(pDVar17->feature_resolver_).
                                         super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<google::protobuf::FeatureResolver>
                                         ._M_payload + 0x1c);
          if (lVar49 <= lVar53) {
            pcVar41 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar53,lVar49,"index < message_type_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_1e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xae7,pcVar41);
            goto LAB_00165c7d;
          }
          lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                    super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                    .super__Optional_payload_base<google::protobuf::FeatureResolver>
                                    ._M_payload._M_value.defaults_ + 0x40);
          pVVar32 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                              (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                               (int)lVar53);
          DetectMapConflicts(this,(Descriptor *)(lVar49 + lVar52),pVVar32);
          lVar53 = lVar53 + 1;
          lVar52 = lVar52 + 0xa0;
        } while (lVar53 < *(int *)((long)&proto->field_0 + 0x28));
        bVar14 = this->had_errors_;
      }
      if ((((bVar14 & 1) == 0) &&
          (absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::AssertNotDebugCapacity
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       *)local_1f8),
          1 < (this->unused_dependency_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .size_)) && (this->pool_->lazily_build_dependencies_ == false)) {
        LogUnusedDependency(this,proto,result_00);
      }
      bVar14 = this->had_errors_;
      if (((bool)bVar14 == false) && (this->pool_->lazily_build_dependencies_ == false)) {
        pOVar36 = (pDVar17->options_to_interpret_).
                  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_208 = this;
        local_200 = proto;
        if (pOVar36 != (pointer)_FeatureSet_default_instance_) {
          rStack_1d0.settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ = (size_t)(pDVar17->tables_->pending_files_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
          local_1d8.value =
               (PointerT<google::protobuf::SourceCodeInfo>)
               (pDVar17->tables_->pending_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          puVar18 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          rStack_1d0.settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          heap_or_soo_.heap.control = (ctrl_t *)*puVar18;
          rStack_1d0.settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_ = puVar18[1];
          local_1e8._8_8_ = proto;
          local_1e8._0_8_ = pOVar36;
          local_230 = pDVar17;
          absl::lts_20250127::container_internal::
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
          ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
                    (&local_220,&this->deferred_validation_->lifetimes_info_map_,
                     (FileDescriptor **)&local_230);
          iVar9._M_current =
               (LifetimesInfo *)
               ((Base<google::protobuf::SourceCodeInfo> *)
               ((long)local_220.first.field_1.slot_ + 0x10))->value;
          if ((PointerT<google::protobuf::FileDescriptorTables>)iVar9._M_current ==
              ((Base<google::protobuf::FileDescriptorTables> *)
              ((long)local_220.first.field_1.slot_ + 0x18))->value) {
            std::
            vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
            ::_M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                      ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                        *)((long)local_220.first.field_1.slot_ + 8),iVar9,(LifetimesInfo *)local_1e8
                      );
          }
          else {
            ((iVar9._M_current)->filename)._M_len =
                 rStack_1d0.settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.size_;
            ((iVar9._M_current)->filename)._M_str =
                 rStack_1d0.settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.control;
            ((iVar9._M_current)->full_name)._M_len = (size_t)local_1d8.value;
            ((iVar9._M_current)->full_name)._M_str =
                 (char *)rStack_1d0.settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.capacity_;
            (iVar9._M_current)->proto_features = (FeatureSet *)local_1e8._0_8_;
            (iVar9._M_current)->proto = (Message *)local_1e8._8_8_;
            ((Base<google::protobuf::SourceCodeInfo> *)((long)local_220.first.field_1.slot_ + 0x10))
            ->value = (PointerT<google::protobuf::SourceCodeInfo>)
                      ((long)&((Base<google::protobuf::SourceCodeInfo> *)
                              ((long)local_220.first.field_1.slot_ + 0x10))->value->field_0 + 0x20);
          }
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x1c)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x40);
            pVVar32 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
            ::Visit<google::protobuf::DescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                        *)&local_208,(Descriptor *)(lVar49 + lVar52),pVVar32);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0xa0;
          } while (lVar53 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x1c));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x20)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x48);
            pVVar34 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
            ::Visit<google::protobuf::EnumDescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                        *)&local_208,(EnumDescriptor *)(lVar49 + lVar52),pVVar34);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0x58;
          } while (lVar53 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x20));
        }
        if (0 < *(int *)((long)&pDVar17->pool_ + 4)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            pOVar36 = (pDVar17->options_to_interpret_).
                      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                      (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,(int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
            ::Visit<google::protobuf::FieldDescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                        *)this,(FieldDescriptor *)proto,
                       (FieldDescriptorProto *)
                       ((long)&(pOVar36->name_scope)._M_dataplus._M_p + lVar52));
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0x58;
          } while (lVar53 < *(int *)((long)&pDVar17->pool_ + 4));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x24)) {
          local_1f0 = &(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase;
          lVar52 = 0;
          do {
            lVar53 = lVar52 * 0x40 +
                     *(long *)&(pDVar17->feature_resolver_).
                               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                               ._M_payload.
                               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                               .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                               _M_engaged;
            aVar39.slot_ = (slot_type *)
                           internal::RepeatedPtrFieldBase::
                           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                     (local_1f0,(int)lVar52);
            if (*(ctrl_t **)(lVar53 + 0x20) != _FeatureSet_default_instance_) {
              local_230 = *(DescriptorBuilder **)(lVar53 + 0x10);
              local_1d8.value =
                   (PointerT<google::protobuf::SourceCodeInfo>)
                   (ulong)*(ushort *)(*(long *)(lVar53 + 8) + 2);
              puVar18 = (undefined8 *)
                        ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
              ;
              rStack_1d0.settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.control = (ctrl_t *)*puVar18;
              rStack_1d0.settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .size_ = puVar18[1];
              local_1e8._8_8_ = aVar39.slot_;
              local_1e8._0_8_ = *(ctrl_t **)(lVar53 + 0x20);
              rStack_1d0.settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .capacity_ = ~(ulong)local_1d8.value + *(long *)(lVar53 + 8);
              absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
              ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
                        (&local_220,&this->deferred_validation_->lifetimes_info_map_,
                         (FileDescriptor **)&local_230);
              iVar9._M_current =
                   (LifetimesInfo *)
                   ((Base<google::protobuf::SourceCodeInfo> *)
                   ((long)local_220.first.field_1.slot_ + 0x10))->value;
              if ((PointerT<google::protobuf::FileDescriptorTables>)iVar9._M_current ==
                  ((Base<google::protobuf::FileDescriptorTables> *)
                  ((long)local_220.first.field_1.slot_ + 0x18))->value) {
                std::
                vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                ::
                _M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                          ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                            *)((long)local_220.first.field_1.slot_ + 8),iVar9,
                           (LifetimesInfo *)local_1e8);
              }
              else {
                ((iVar9._M_current)->filename)._M_len =
                     rStack_1d0.settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.size_;
                ((iVar9._M_current)->filename)._M_str =
                     rStack_1d0.settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_.heap.control;
                ((iVar9._M_current)->full_name)._M_len = (size_t)local_1d8.value;
                ((iVar9._M_current)->full_name)._M_str =
                     (char *)rStack_1d0.settings_.
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value.capacity_;
                (iVar9._M_current)->proto_features = (FeatureSet *)local_1e8._0_8_;
                (iVar9._M_current)->proto = (Message *)local_1e8._8_8_;
                ((Base<google::protobuf::SourceCodeInfo> *)
                ((long)local_220.first.field_1.slot_ + 0x10))->value =
                     (PointerT<google::protobuf::SourceCodeInfo>)
                     ((long)&((Base<google::protobuf::SourceCodeInfo> *)
                             ((long)local_220.first.field_1.slot_ + 0x10))->value->field_0 + 0x20);
              }
            }
            if (0 < *(int *)(lVar53 + 0x38)) {
              lVar54 = 8;
              lVar49 = 0;
              do {
                lVar10 = *(long *)(lVar53 + 0x30);
                aVar40.slot_ = (slot_type *)
                               internal::RepeatedPtrFieldBase::
                               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                         ((RepeatedPtrFieldBase *)((long)aVar39.slot_ + 0x18),
                                          (int)lVar49);
                pcVar11 = *(ctrl_t **)(lVar10 + 0x38 + lVar54);
                if (pcVar11 != _FeatureSet_default_instance_) {
                  local_230 = *(DescriptorBuilder **)(*(long *)(lVar10 + 8 + lVar54) + 0x10);
                  local_1d8.value =
                       (PointerT<google::protobuf::SourceCodeInfo>)
                       (ulong)*(ushort *)(*(long *)(lVar10 + lVar54) + 2);
                  puVar18 = (undefined8 *)
                            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                            0xfffffffffffffffc);
                  rStack_1d0.settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control = (ctrl_t *)*puVar18;
                  rStack_1d0.settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.size_ = puVar18[1];
                  local_1e8._8_8_ = aVar40.slot_;
                  local_1e8._0_8_ = pcVar11;
                  rStack_1d0.settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_ = ~(ulong)local_1d8.value + *(long *)(lVar10 + lVar54);
                  absl::lts_20250127::container_internal::
                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                  ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
                            (&local_220,&this->deferred_validation_->lifetimes_info_map_,
                             (FileDescriptor **)&local_230);
                  iVar9._M_current =
                       (LifetimesInfo *)
                       ((Base<google::protobuf::SourceCodeInfo> *)
                       ((long)local_220.first.field_1.slot_ + 0x10))->value;
                  if ((PointerT<google::protobuf::FileDescriptorTables>)iVar9._M_current ==
                      ((Base<google::protobuf::FileDescriptorTables> *)
                      ((long)local_220.first.field_1.slot_ + 0x18))->value) {
                    std::
                    vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                    ::
                    _M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                              ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                                *)((long)local_220.first.field_1.slot_ + 8),iVar9,
                               (LifetimesInfo *)local_1e8);
                  }
                  else {
                    ((iVar9._M_current)->filename)._M_len =
                         rStack_1d0.settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.size_;
                    ((iVar9._M_current)->filename)._M_str =
                         rStack_1d0.settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.control;
                    ((iVar9._M_current)->full_name)._M_len = (size_t)local_1d8.value;
                    ((iVar9._M_current)->full_name)._M_str =
                         (char *)rStack_1d0.settings_.
                                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                 .
                                 super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                 .value.capacity_;
                    (iVar9._M_current)->proto_features = (FeatureSet *)local_1e8._0_8_;
                    (iVar9._M_current)->proto = (Message *)local_1e8._8_8_;
                    ((Base<google::protobuf::SourceCodeInfo> *)
                    ((long)local_220.first.field_1.slot_ + 0x10))->value =
                         (PointerT<google::protobuf::SourceCodeInfo>)
                         ((long)&((Base<google::protobuf::SourceCodeInfo> *)
                                 ((long)local_220.first.field_1.slot_ + 0x10))->value->field_0 +
                         0x20);
                  }
                }
                lVar49 = lVar49 + 1;
                lVar54 = lVar54 + 0x50;
              } while (lVar49 < *(int *)(lVar53 + 0x38));
            }
            lVar52 = lVar52 + 1;
          } while (lVar52 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x24));
        }
        bVar14 = this->had_errors_;
      }
      if (((bVar14 & 1) == 0) && (this->pool_->enforce_naming_style_ == true)) {
        local_1e8._0_8_ = this;
        if (*(int *)(*(long *)&pDVar17->had_errors_ + 0x48) == 1) {
          ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>
                    (this,(FileDescriptor *)pDVar17,proto);
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x1c)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x40);
            pVVar32 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
            ::Visit<google::protobuf::DescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
                        *)local_1e8,(Descriptor *)(lVar49 + lVar52),pVVar32);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0xa0;
          } while (lVar53 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x1c));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x20)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            lVar49 = *(long *)((long)&(pDVar17->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x48);
            pVVar34 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            internal::
            VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
            ::Visit<google::protobuf::EnumDescriptorProto_const>
                      ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
                        *)local_1e8,(EnumDescriptor *)(lVar49 + lVar52),pVVar34);
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0x58;
          } while (lVar53 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x20));
        }
        if (0 < *(int *)((long)&pDVar17->pool_ + 4)) {
          lVar52 = 0;
          lVar53 = 0;
          do {
            pOVar36 = (pDVar17->options_to_interpret_).
                      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar37 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                 (int)lVar53);
            if (*(int *)(*(long *)((long)&(pOVar36->element_path).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  lVar52 + 8) + 0x48) == 1) {
              ValidateNamingStyle<google::protobuf::FieldDescriptor,google::protobuf::FieldDescriptorProto>
                        (this,(FieldDescriptor *)
                              ((long)&(pOVar36->name_scope)._M_dataplus._M_p + lVar52),pVVar37);
            }
            lVar53 = lVar53 + 1;
            lVar52 = lVar52 + 0x58;
          } while (lVar53 < *(int *)((long)&pDVar17->pool_ + 4));
        }
        if (0 < *(int *)((long)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x24)) {
          lVar52 = 0;
          do {
            pSVar51 = (ServiceDescriptor *)
                      (lVar52 * 0x40 +
                      *(long *)&(pDVar17->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_engaged);
            pVVar35 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                                 (int)lVar52);
            if ((pSVar51->merged_features_->field_0)._impl_.enforce_naming_style_ == 1) {
              ValidateNamingStyle<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
                        (this,pSVar51,pVVar35);
            }
            if (0 < pSVar51->method_count_) {
              lVar53 = 0;
              lVar49 = 0;
              do {
                pMVar6 = pSVar51->methods_;
                pVVar38 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                    (&(pVVar35->field_0)._impl_.method_.super_RepeatedPtrFieldBase,
                                     (int)lVar49);
                if (*(int *)(*(long *)((long)&pMVar6->merged_features_ + lVar53) + 0x48) == 1) {
                  ValidateNamingStyle<google::protobuf::MethodDescriptor,google::protobuf::MethodDescriptorProto>
                            (this,(MethodDescriptor *)(&pMVar6->super_SymbolBase + lVar53),pVVar38);
                }
                lVar49 = lVar49 + 1;
                lVar53 = lVar53 + 0x50;
              } while (lVar49 < pSVar51->method_count_);
            }
            lVar52 = lVar52 + 1;
          } while (lVar52 < *(int *)((long)&(pDVar17->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x24));
        }
        bVar14 = this->had_errors_;
        local_248 = local_228;
      }
      if ((bVar14 & 1) == 0) {
        CheckVisibilityRules(this,(FileDescriptor *)local_248,proto);
        if ((this->had_errors_ & 1U) != 0) {
          local_248 = (DescriptorBuilder *)0x0;
        }
      }
      else {
LAB_00165a8b:
        local_248 = (DescriptorBuilder *)0x0;
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)local_c8);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)local_a8);
      goto LAB_00165ae5;
    }
    plVar25 = (long *)((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar44 = (pointer)*plVar25;
    sVar47 = plVar25[1];
    pcVar50 = "A file with this name is already in the pool.";
    location = OTHER;
LAB_001643ee:
    element_name_02._M_str = pcVar44;
    element_name_02._M_len = sVar47;
    AddError(this,element_name_02,&proto->super_Message,location,pcVar50);
  }
  else {
    __s = (pDVar17->tables_->pending_files_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pvVar23 = memchr(__s,0,(size_t)__n_00);
    if ((long)pvVar23 - (long)__s == -1 || pvVar23 == (void *)0x0) goto LAB_00164371;
    local_f8 = local_1e8;
    local_1e8._0_8_ = &local_228;
    pcStack_f0 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
    ;
    make_error_01.invoker_._0_4_ = 0x179979;
    make_error_01.ptr_.obj = local_f8;
    make_error_01.invoker_._4_4_ = 0;
    element_name_01._M_str = (char *)__s;
    element_name_01._M_len = (size_t)__n_00;
    AddError(this,element_name_01,&proto->super_Message,NAME,make_error_01);
  }
  local_248 = (DescriptorBuilder *)0x0;
LAB_00165ae5:
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
  ~StatusOrData(&local_88);
  return (FileDescriptor *)local_248;
}

Assistant:

FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto, internal::FlatAllocator& alloc) {
  FileDescriptor* result = alloc.AllocateArray<FileDescriptor>(1);
  file_ = result;

  if (proto.has_edition()) {
    file_->edition_ = proto.edition();
  } else if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->edition_ = Edition::EDITION_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->edition_ = Edition::EDITION_PROTO3;
  } else {
    file_->edition_ = Edition::EDITION_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER, [&] {
      return absl::StrCat("Unrecognized syntax: ", proto.syntax());
    });
  }

  const FeatureSetDefaults& defaults = pool_->GetFeatureSetDefaults();

  absl::StatusOr<FeatureResolver> feature_resolver =
      FeatureResolver::Create(file_->edition_, defaults);
  if (!feature_resolver.ok()) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::EDITIONS,
             [&] { return std::string(feature_resolver.status().message()); });
  } else {
    feature_resolver_.emplace(std::move(feature_resolver).value());
  }

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  SourceCodeInfo* info = nullptr;
  if (proto.has_source_code_info()) {
    info = alloc.AllocateArray<SourceCodeInfo>(1);
    *info = proto.source_code_info();
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = alloc.AllocateArray<FileDescriptorTables>(1);
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  result->name_ = alloc.AllocateStrings(proto.name());
  if (proto.has_package()) {
    result->package_ = alloc.AllocateStrings(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = alloc.AllocateStrings("");
  }
  result->pool_ = pool_;

  if (absl::StrContains(result->name(), '\0')) {
    AddError(result->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", result->name(), "\" contains null character.");
    });
    return nullptr;
  }

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    return nullptr;
  }
  if (!result->package().empty()) {
    if (std::count(result->package().begin(), result->package().end(), '.') >
        kPackageLimit) {
      AddError(result->package(), proto, DescriptorPool::ErrorCollector::NAME,
               "Exceeds Maximum Package Depth");
      return nullptr;
    }
    AddPackage(result->package(), proto, result, true);
  }

  // Make sure all dependencies are loaded.
  absl::flat_hash_set<absl::string_view> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      alloc.AllocateArray<const FileDescriptor*>(proto.dependency_size());
  result->dependencies_once_ = nullptr;
  unused_dependency_.clear();
  absl::flat_hash_set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }

  bool need_lazy_deps = false;
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == nullptr && pool_->underlay_ != nullptr) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      return nullptr;
    }

    if (dependency == nullptr) {
      if (!pool_->lazily_build_dependencies_) {
        if (pool_->allow_unknown_ ||
            (!pool_->enforce_weak_ && weak_deps.contains(i))) {
          internal::FlatAllocator lazy_dep_alloc;
          lazy_dep_alloc.PlanArray<FileDescriptor>(1);
          lazy_dep_alloc.PlanArray<std::string>(1);
          lazy_dep_alloc.FinalizePlanning(tables_);
          dependency = pool_->NewPlaceholderFileWithMutexHeld(
              proto.dependency(i), lazy_dep_alloc);
        } else {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->direct_input_files_.find(proto.name()) !=
           pool_->direct_input_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      need_lazy_deps = true;
    }
  }
  if (need_lazy_deps) {
    int total_char_size = 0;
    for (int i = 0; i < proto.dependency_size(); i++) {
      if (result->dependencies_[i] == nullptr) {
        total_char_size += static_cast<int>(proto.dependency(i).size());
      }
      ++total_char_size;  // For NUL char
    }

    void* data = tables_->AllocateBytes(
        static_cast<int>(sizeof(absl::once_flag)) + total_char_size);
    result->dependencies_once_ = ::new (data) absl::once_flag{};
    char* name_data = reinterpret_cast<char*>(result->dependencies_once_ + 1);

    for (int i = 0; i < proto.dependency_size(); i++) {
      if (result->dependencies_[i] == nullptr) {
        memcpy(name_data, proto.dependency(i).data(),
               proto.dependency(i).size());
        name_data += proto.dependency(i).size();
      }
      *name_data++ = '\0';
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ =
      alloc.AllocateArray<int>(proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ =
      alloc.AllocateArray<int>(proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage, nullptr);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, nullptr);
  BUILD_ARRAY(proto, result, service, BuildService, nullptr);
  BUILD_ARRAY(proto, result, extension, BuildExtension, nullptr);

  // Copy options.
  AllocateOptions(proto, result, alloc);

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  if (!message_hints_.empty()) {
    SuggestFieldNumbers(result, proto);
  }

  // Interpret only the non-extension options first, including features and
  // their extensions.  This has to be done in two passes, since option
  // extensions defined in this file may have features attached to them.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretNonExtensionOptions(&(*iter));
    }

    // Handle feature resolution.  This must occur after option interpretation,
    // but before validation.
    {
      auto cleanup = DisableTracking();
      internal::VisitDescriptors(
          *result, proto, [&](const auto& descriptor, const auto& proto) {
            using OptionsT =
                typename std::remove_const<typename std::remove_pointer<
                    decltype(descriptor.options_)>::type>::type;
            using DescriptorT =
                typename std::remove_const<typename std::remove_reference<
                    decltype(descriptor)>::type>::type;

            ResolveFeatures(
                proto, const_cast<DescriptorT*>(&descriptor),
                const_cast<  // NOLINT(google3-runtime-proto-const-cast)
                    OptionsT*>(descriptor.options_),
                alloc);
          });
    }

    // Post-process cleanup for field features.
    internal::VisitDescriptors(
        *result, proto,
        [&](const FieldDescriptor& field, const FieldDescriptorProto& proto) {
          PostProcessFieldFeatures(const_cast<FieldDescriptor&>(field), proto);
        });

    // Interpret any remaining uninterpreted options gathered into
    // options_to_interpret_ during descriptor building.  Cross-linking has made
    // extension options known, so all interpretations should now succeed.
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptionExtensions(&(*iter));
    }
    options_to_interpret_.clear();
    if (info != nullptr) {
      option_interpreter.UpdateSourceCodeInfo(info);
    }
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          ValidateOptions(&descriptor, desc_proto);
        });
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking. Also, don't log unused dependencies if there were previous
  // errors, since the results might be inaccurate.
  if (!had_errors_ && !unused_dependency_.empty() &&
      !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  // Store feature information for deferred validation outside of the database
  // mutex.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          if (descriptor.proto_features_ != &FeatureSet::default_instance()) {
            deferred_validation_.ValidateFeatureLifetimes(
                GetFile(descriptor), {descriptor.proto_features_, &desc_proto,
                                      GetFullName(descriptor), proto.name()});
          }
        });
  }

  if (!had_errors_ && pool_->enforce_naming_style_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          if (internal::InternalFeatureHelper::GetFeatures(descriptor)
                  .enforce_naming_style() == FeatureSet::STYLE2024) {
            ValidateNamingStyle(&descriptor, desc_proto);
          }
        });
  }
  if (!had_errors_) {
    // Check Symbol Visibility Rules.
    CheckVisibilityRules(result, proto);
  }

  if (had_errors_) {
    return nullptr;
  } else {
    return result;
  }
}